

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::CovergroupType::inheritMembers
          (CovergroupType *this,function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  char *pcVar1;
  SyntaxNode *pSVar2;
  Scope *this_00;
  Compilation *this_01;
  SourceLocation SVar3;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_02;
  long lVar4;
  size_t __n;
  uint uVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  size_t sVar10;
  int iVar11;
  Symbol *pSVar12;
  Type *pTVar13;
  Diagnostic *pDVar14;
  uint64_t uVar15;
  TransparentMemberSymbol *pTVar16;
  uint uVar17;
  Symbol *member;
  SyntaxNode **this_03;
  ulong uVar18;
  long lVar19;
  Symbol *args;
  SourceLocation args_00;
  ulong uVar20;
  size_t *psVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  string_view name;
  SourceRange sourceRange;
  
  pSVar2 = (this->super_Type).super_Symbol.originatingSyntax;
  if (pSVar2[4].parent != (SyntaxNode *)0x0) {
    this_00 = (this->super_Type).super_Symbol.parentScope;
    this_01 = this_00->compilation;
    this->baseGroup = this_01->errorType;
    pSVar12 = this_00->thisSym;
    if (pSVar12[1].indexInScope != 0) {
      Scope::elaborate((Scope *)&pSVar12[1].name);
    }
    SVar3 = pSVar12[2].location;
    if ((SVar3 != (SourceLocation)0x0) && (*(int *)SVar3 == 0x16)) {
      this_03 = &pSVar2[4].previewNode;
      name = parsing::Token::valueText((Token *)this_03);
      pSVar12 = Scope::find((Scope *)((long)SVar3 + 0x48),name);
      if ((pSVar12 != (Symbol *)0x0) &&
         ((pSVar12->kind == ClassProperty &&
          (pTVar13 = DeclaredType::getType((DeclaredType *)(pSVar12 + 1)),
          (pTVar13->super_Symbol).kind == CovergroupType)))) {
        this->baseGroup = pTVar13;
      }
      pTVar13 = this->baseGroup;
      if (pTVar13->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar13);
      }
      if ((pTVar13->canonical->super_Symbol).kind == ErrorType) {
        if (name._M_len != 0) {
          sourceRange = parsing::Token::range((Token *)this_03);
          pDVar14 = Scope::addDiag(this_00,(DiagCode)0xcd0006,sourceRange);
          pDVar14 = Diagnostic::operator<<(pDVar14,name);
          Diagnostic::operator<<(pDVar14,*(string_view *)((long)SVar3 + 8));
          return;
        }
      }
      else {
        pTVar13 = this->baseGroup;
        if (*(int *)&pTVar13[1].super_Symbol.nextInScope != 0) {
          Scope::elaborate((Scope *)(pTVar13 + 1));
        }
        sVar10 = *(size_t *)&pTVar13[2].super_Symbol;
        (this->arguments)._M_ptr = (pointer)pTVar13[1].canonical;
        (this->arguments)._M_extent._M_extent_value = sVar10;
        pcVar1 = pTVar13[2].super_Symbol.name._M_str;
        (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload
        .super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload =
             (_Storage<const_slang::ast::TimingControl_*,_true>)pTVar13[2].super_Symbol.name._M_len;
        *(char **)&(this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>
                   ._M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>.
                   _M_engaged = pcVar1;
        this_02 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                  (this->body->super_Scope).nameMap;
        if (*(int *)&pTVar13[1].super_Symbol.nextInScope != 0) {
          Scope::elaborate((Scope *)(pTVar13 + 1));
        }
        pSVar2 = pTVar13[1].super_Symbol.originatingSyntax;
        if (*(int *)&pSVar2[4].parent != 0) {
          Scope::elaborate((Scope *)&pSVar2[2].previewNode);
        }
        for (pSVar12 = (Symbol *)pSVar2[3].previewNode; pSVar12 != (Symbol *)0x0;
            pSVar12 = pSVar12->nextInScope) {
          if ((pSVar12->name)._M_len != 0) {
            uVar15 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               (this_02,&pSVar12->name);
            uVar18 = uVar15 >> ((byte)*this_02 & 0x3f);
            lVar4 = *(long *)(this_02 + 0x10);
            lVar19 = (uVar15 & 0xff) * 4;
            cVar6 = (&UNK_009584ac)[lVar19];
            cVar7 = (&UNK_009584ad)[lVar19];
            cVar8 = (&UNK_009584ae)[lVar19];
            cVar9 = (&UNK_009584af)[lVar19];
            uVar20 = 0;
            do {
              pcVar1 = (char *)(lVar4 + uVar18 * 0x10);
              auVar23[0] = -(*pcVar1 == cVar6);
              auVar23[1] = -(pcVar1[1] == cVar7);
              auVar23[2] = -(pcVar1[2] == cVar8);
              auVar23[3] = -(pcVar1[3] == cVar9);
              auVar23[4] = -(pcVar1[4] == cVar6);
              auVar23[5] = -(pcVar1[5] == cVar7);
              auVar23[6] = -(pcVar1[6] == cVar8);
              auVar23[7] = -(pcVar1[7] == cVar9);
              auVar23[8] = -(pcVar1[8] == cVar6);
              auVar23[9] = -(pcVar1[9] == cVar7);
              auVar23[10] = -(pcVar1[10] == cVar8);
              auVar23[0xb] = -(pcVar1[0xb] == cVar9);
              auVar23[0xc] = -(pcVar1[0xc] == cVar6);
              auVar23[0xd] = -(pcVar1[0xd] == cVar7);
              auVar23[0xe] = -(pcVar1[0xe] == cVar8);
              auVar23[0xf] = -(pcVar1[0xf] == cVar9);
              uVar17 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
              if (uVar17 != 0) {
                lVar19 = *(long *)(this_02 + 0x18);
                __n = (pSVar12->name)._M_len;
                pcVar1 = (pSVar12->name)._M_str;
                do {
                  uVar5 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                    }
                  }
                  psVar21 = (size_t *)((ulong)uVar5 * 0x18 + lVar19 + uVar18 * 0x168);
                  bVar22 = __n == *psVar21;
                  if (bVar22 && __n != 0) {
                    iVar11 = bcmp(pcVar1,(void *)psVar21[1],__n);
                    bVar22 = iVar11 == 0;
                  }
                  if (bVar22) goto LAB_0078e931;
                  uVar17 = uVar17 - 1 & uVar17;
                } while (uVar17 != 0);
              }
              if ((*(byte *)(uVar18 * 0x10 + lVar4 + 0xf) &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7]) == 0) break;
              lVar19 = uVar18 + uVar20;
              uVar20 = uVar20 + 1;
              uVar18 = lVar19 + 1U & *(ulong *)(this_02 + 8);
            } while (uVar20 <= *(ulong *)(this_02 + 8));
            psVar21 = (size_t *)0x0;
LAB_0078e931:
            if (psVar21 == (size_t *)0x0) {
              args = pSVar12;
              if (pSVar12->kind == TransparentMember) {
                args = *(Symbol **)(pSVar12 + 1);
              }
              pTVar16 = BumpAllocator::
                        emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                                  (&this_01->super_BumpAllocator,args);
              Scope::insertMember(&this->body->super_Scope,&pTVar16->super_Symbol,
                                  this->body->lastBuiltinMember,true,false);
            }
          }
        }
        if (*(int *)&pTVar13[1].super_Symbol.nextInScope != 0) {
          Scope::elaborate((Scope *)(pTVar13 + 1));
        }
        for (SVar3 = pTVar13[1].super_Symbol.location; SVar3 != (SourceLocation)0x0;
            SVar3 = *(SourceLocation *)((long)SVar3 + 0x28)) {
          args_00 = SVar3;
          if (*(int *)SVar3 == 5) {
            args_00 = *(SourceLocation *)((long)SVar3 + 0x40);
          }
          if (*(int *)args_00 == 0x3d) {
            pTVar16 = BumpAllocator::
                      emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                                (&this_01->super_BumpAllocator,(Symbol *)args_00);
            (*insertCB.callback)(insertCB.callable,&pTVar16->super_Symbol);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CovergroupType::inheritMembers(function_ref<void(const Symbol&)> insertCB) const {
    auto syntax = getSyntax();
    auto scope = getParentScope();
    SLANG_ASSERT(syntax && scope);

    // If this covergroup doesn't inherit from anything then there's nothing to do.
    auto& cds = syntax->as<CovergroupDeclarationSyntax>();
    if (!cds.extends)
        return;

    auto& comp = scope->getCompilation();
    baseGroup = &comp.getErrorType();

    // Find the base class's group from which we are inheriting.
    auto baseClass = scope->asSymbol().as<ClassType>().getBaseClass();
    if (!baseClass || baseClass->kind != SymbolKind::ClassType)
        return;

    auto baseName = cds.name.valueText();
    auto candidateBase = baseClass->as<ClassType>().find(baseName);
    if (candidateBase && candidateBase->kind == SymbolKind::ClassProperty) {
        auto& ct = candidateBase->as<ClassPropertySymbol>().getType();
        if (ct.kind == SymbolKind::CovergroupType)
            baseGroup = &ct;
    }

    if (baseGroup->isError()) {
        if (!baseName.empty()) {
            scope->addDiag(diag::UnknownCovergroupBase, cds.name.range())
                << baseName << baseClass->name;
        }
        return;
    }

    auto& baseCG = baseGroup->as<CovergroupType>();
    arguments = baseCG.getArguments();
    event = baseCG.event;

    // We have the base group -- inherit all of the members from it.
    auto& scopeNameMap = body.getUnelaboratedNameMap();
    for (auto& member : baseCG.getBody().members()) {
        if (member.name.empty())
            continue;

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        body.insertMember(wrapper, body.lastBuiltinMember, true, false);
    }

    // Also inherit any argument symbols are in the base covergroup type itself,
    // as opposed to the body which we already looked at above.
    for (auto& member : baseCG.members()) {
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        if (toWrap->kind == SymbolKind::FormalArgument) {
            auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
            insertCB(*wrapper);
        }
    }
}